

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O3

void calc_tag(uint8_t *tag,uint8_t *key,uint8_t *nonce,uint8_t *ad,size_t ad_len,uint8_t *ciphertext
             ,size_t ciphertext_len,uint8_t *ciphertext_extra,size_t ciphertext_extra_len)

{
  uint i;
  long lVar1;
  ulong uVar2;
  uint8_t length_bytes [8];
  poly1305_state ctx;
  uint8_t local_268 [8];
  uint8_t *local_260;
  uint8_t local_258 [552];
  
  local_258[0x10] = '\0';
  local_258[0x11] = '\0';
  local_258[0x12] = '\0';
  local_258[0x13] = '\0';
  local_258[0x14] = '\0';
  local_258[0x15] = '\0';
  local_258[0x16] = '\0';
  local_258[0x17] = '\0';
  local_258[0x18] = '\0';
  local_258[0x19] = '\0';
  local_258[0x1a] = '\0';
  local_258[0x1b] = '\0';
  local_258[0x1c] = '\0';
  local_258[0x1d] = '\0';
  local_258[0x1e] = '\0';
  local_258[0x1f] = '\0';
  local_258[0] = '\0';
  local_258[1] = '\0';
  local_258[2] = '\0';
  local_258[3] = '\0';
  local_258[4] = '\0';
  local_258[5] = '\0';
  local_258[6] = '\0';
  local_258[7] = '\0';
  local_258[8] = '\0';
  local_258[9] = '\0';
  local_258[10] = '\0';
  local_258[0xb] = '\0';
  local_258[0xc] = '\0';
  local_258[0xd] = '\0';
  local_258[0xe] = '\0';
  local_258[0xf] = '\0';
  local_260 = tag;
  CRYPTO_chacha_20(local_258,local_258,0x20,key,nonce,0);
  CRYPTO_poly1305_init((poly1305_state *)(local_258 + 0x20),local_258);
  CRYPTO_poly1305_update((poly1305_state *)(local_258 + 0x20),ad,ad_len);
  if ((ad_len & 0xf) != 0) {
    CRYPTO_poly1305_update((poly1305_state *)(local_258 + 0x20),"",0x10 - (ad_len & 0xf));
  }
  CRYPTO_poly1305_update((poly1305_state *)(local_258 + 0x20),ciphertext,ciphertext_len);
  CRYPTO_poly1305_update((poly1305_state *)(local_258 + 0x20),ciphertext_extra,ciphertext_extra_len)
  ;
  uVar2 = ciphertext_extra_len + ciphertext_len;
  if ((uVar2 & 0xf) != 0) {
    CRYPTO_poly1305_update((poly1305_state *)(local_258 + 0x20),"",0x10 - (uVar2 & 0xf));
  }
  lVar1 = 0;
  do {
    local_268[lVar1] = (uint8_t)ad_len;
    ad_len = ad_len >> 8;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  CRYPTO_poly1305_update((poly1305_state *)(local_258 + 0x20),local_268,8);
  lVar1 = 0;
  do {
    local_268[lVar1] = (uint8_t)uVar2;
    uVar2 = uVar2 >> 8;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  CRYPTO_poly1305_update((poly1305_state *)(local_258 + 0x20),local_268,8);
  CRYPTO_poly1305_finish((poly1305_state *)(local_258 + 0x20),local_260);
  return;
}

Assistant:

static void calc_tag(uint8_t tag[POLY1305_TAG_LEN], const uint8_t *key,
                     const uint8_t nonce[12], const uint8_t *ad, size_t ad_len,
                     const uint8_t *ciphertext, size_t ciphertext_len,
                     const uint8_t *ciphertext_extra,
                     size_t ciphertext_extra_len) {
  alignas(16) uint8_t poly1305_key[32];
  OPENSSL_memset(poly1305_key, 0, sizeof(poly1305_key));
  CRYPTO_chacha_20(poly1305_key, poly1305_key, sizeof(poly1305_key), key, nonce,
                   0);

  static const uint8_t padding[16] = { 0 };  // Padding is all zeros.
  poly1305_state ctx;
  CRYPTO_poly1305_init(&ctx, poly1305_key);
  CRYPTO_poly1305_update(&ctx, ad, ad_len);
  if (ad_len % 16 != 0) {
    CRYPTO_poly1305_update(&ctx, padding, sizeof(padding) - (ad_len % 16));
  }
  CRYPTO_poly1305_update(&ctx, ciphertext, ciphertext_len);
  CRYPTO_poly1305_update(&ctx, ciphertext_extra, ciphertext_extra_len);
  const size_t ciphertext_total = ciphertext_len + ciphertext_extra_len;
  if (ciphertext_total % 16 != 0) {
    CRYPTO_poly1305_update(&ctx, padding,
                           sizeof(padding) - (ciphertext_total % 16));
  }
  poly1305_update_length(&ctx, ad_len);
  poly1305_update_length(&ctx, ciphertext_total);
  CRYPTO_poly1305_finish(&ctx, tag);
}